

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

void CLPIParser::parseProgramInfo
               (uint8_t *buffer,uint8_t *end,
               vector<CLPIProgramInfo,_std::allocator<CLPIProgramInfo>_> *programInfoMap,
               map<int,_CLPIStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_CLPIStreamInfo>_>_>
               *streamInfoMap)

{
  undefined4 uVar1;
  byte bVar2;
  uchar uVar3;
  unsigned_short uVar4;
  uint uVar5;
  reference pvVar6;
  mapped_type *this;
  uint local_b8 [4];
  undefined1 local_a8 [8];
  CLPIStreamInfo streamInfo;
  int iStack_50;
  unsigned_short pid;
  int stream_index;
  int i;
  uchar number_of_program_sequences;
  BitStreamReader reader;
  map<int,_CLPIStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_CLPIStreamInfo>_>_>
  *streamInfoMap_local;
  vector<CLPIProgramInfo,_std::allocator<CLPIProgramInfo>_> *programInfoMap_local;
  uint8_t *end_local;
  uint8_t *buffer_local;
  
  reader._24_8_ = streamInfoMap;
  BitStreamReader::BitStreamReader((BitStreamReader *)&i);
  BitStreamReader::setBuffer((BitStreamReader *)&i,buffer,end);
  BitStreamReader::skipBits((BitStreamReader *)&i,0x20);
  BitStreamReader::skipBits((BitStreamReader *)&i,8);
  bVar2 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)&i,8);
  for (iStack_50 = 0; iStack_50 < (int)(uint)bVar2; iStack_50 = iStack_50 + 1) {
    std::vector<CLPIProgramInfo,_std::allocator<CLPIProgramInfo>_>::emplace_back<>(programInfoMap);
    uVar5 = BitStreamReader::getBits((BitStreamReader *)&i,0x20);
    pvVar6 = std::vector<CLPIProgramInfo,_std::allocator<CLPIProgramInfo>_>::operator[]
                       (programInfoMap,(long)iStack_50);
    pvVar6->SPN_program_sequence_start = uVar5;
    uVar4 = BitStreamReader::getBits<unsigned_short>((BitStreamReader *)&i,0x10);
    pvVar6 = std::vector<CLPIProgramInfo,_std::allocator<CLPIProgramInfo>_>::operator[]
                       (programInfoMap,(long)iStack_50);
    pvVar6->program_map_PID = uVar4;
    uVar3 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)&i,8);
    pvVar6 = std::vector<CLPIProgramInfo,_std::allocator<CLPIProgramInfo>_>::operator[]
                       (programInfoMap,(long)iStack_50);
    pvVar6->number_of_streams_in_ps = uVar3;
    BitStreamReader::skipBits((BitStreamReader *)&i,8);
    streamInfo.recording_number[2] = '\0';
    streamInfo.recording_number[3] = '\0';
    streamInfo.recording_number[4] = '\0';
    streamInfo.recording_number[5] = '\0';
    while( true ) {
      uVar1 = streamInfo.recording_number._2_4_;
      pvVar6 = std::vector<CLPIProgramInfo,_std::allocator<CLPIProgramInfo>_>::operator[]
                         (programInfoMap,(long)iStack_50);
      if ((int)(uint)pvVar6->number_of_streams_in_ps <= (int)uVar1) break;
      streamInfo.recording_number._0_2_ =
           BitStreamReader::getBits<unsigned_short>((BitStreamReader *)&i,0x10);
      CLPIStreamInfo::CLPIStreamInfo((CLPIStreamInfo *)local_a8);
      CLPIStreamInfo::parseStreamCodingInfo((CLPIStreamInfo *)local_a8,(BitStreamReader *)&i);
      local_b8[0] = (uint)(ushort)streamInfo.recording_number._0_2_;
      this = std::
             map<int,_CLPIStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_CLPIStreamInfo>_>_>
             ::operator[]((map<int,_CLPIStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_CLPIStreamInfo>_>_>
                           *)reader._24_8_,(key_type_conflict *)local_b8);
      CLPIStreamInfo::operator=(this,(CLPIStreamInfo *)local_a8);
      CLPIStreamInfo::~CLPIStreamInfo((CLPIStreamInfo *)local_a8);
      streamInfo.recording_number._2_4_ = streamInfo.recording_number._2_4_ + 1;
    }
  }
  return;
}

Assistant:

void CLPIParser::parseProgramInfo(uint8_t* buffer, const uint8_t* end, std::vector<CLPIProgramInfo>& programInfoMap,
                                  std::map<int, CLPIStreamInfo>& streamInfoMap)
{
    BitStreamReader reader{};
    reader.setBuffer(buffer, end);
    reader.skipBits(32);  // length
    reader.skipBits(8);   // reserved_for_word_align
    const auto number_of_program_sequences = reader.getBits<uint8_t>(8);
    for (int i = 0; i < number_of_program_sequences; i++)
    {
        programInfoMap.emplace_back();
        programInfoMap[i].SPN_program_sequence_start = reader.getBits(32);
        programInfoMap[i].program_map_PID = reader.getBits<uint16_t>(16);
        programInfoMap[i].number_of_streams_in_ps = reader.getBits<uint8_t>(8);
        reader.skipBits(8);
        for (int stream_index = 0; stream_index < programInfoMap[i].number_of_streams_in_ps; stream_index++)
        {
            const auto pid = reader.getBits<uint16_t>(16);
            CLPIStreamInfo streamInfo;
            streamInfo.parseStreamCodingInfo(reader);
            streamInfoMap[pid] = streamInfo;
        }
    }
}